

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

void SSL_CTX_flush_sessions(SSL_CTX *ctx,long tm)

{
  lhash_st_SSL_SESSION *lh;
  MutexLockBase<&CRYPTO_MUTEX_lock_write,_&CRYPTO_MUTEX_unlock_write> local_38;
  MutexWriteLock lock;
  TIMEOUT_PARAM tp;
  uint64_t time_local;
  SSL_CTX *ctx_local;
  
  lh = *(lhash_st_SSL_SESSION **)&(ctx->stats).sess_connect_good;
  if (lh != (lhash_st_SSL_SESSION *)0x0) {
    lock.mu_ = (CRYPTO_MUTEX *)ctx;
    bssl::internal::MutexLockBase<&CRYPTO_MUTEX_lock_write,_&CRYPTO_MUTEX_unlock_write>::
    MutexLockBase(&local_38,(CRYPTO_MUTEX *)&ctx->cert_store);
    lh_SSL_SESSION_doall_arg(lh,timeout_doall_arg,&lock);
    bssl::internal::MutexLockBase<&CRYPTO_MUTEX_lock_write,_&CRYPTO_MUTEX_unlock_write>::
    ~MutexLockBase(&local_38);
  }
  return;
}

Assistant:

void SSL_CTX_flush_sessions(SSL_CTX *ctx, uint64_t time) {
  TIMEOUT_PARAM tp;

  tp.ctx = ctx;
  tp.cache = ctx->sessions;
  if (tp.cache == NULL) {
    return;
  }
  tp.time = time;
  MutexWriteLock lock(&ctx->lock);
  lh_SSL_SESSION_doall_arg(tp.cache, timeout_doall_arg, &tp);
}